

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O1

void __thiscall
dg::pta::LLVMPointerGraphBuilder::addInterproceduralOperands
          (LLVMPointerGraphBuilder *this,Function *F,PointerSubgraph *subg,CallInst *CI,
          PSNode *callNode)

{
  pointer ppPVar1;
  
  addArgumentsOperands(this,F,CI,0);
  if (0xff < *(uint *)(*(long *)(F + 0x18) + 8)) {
    if (CI == (CallInst *)0x0) {
      addVariadicArgumentOperands(this,F,subg->vararg);
    }
    else {
      addVariadicArgumentOperands(this,F,CI,subg->vararg);
    }
  }
  if ((subg->returnNodes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    addReturnNodesOperands(this,F,subg,callNode);
    return;
  }
  if ((callNode != (PSNode *)0x0) &&
     (ppPVar1 = (callNode->super_SubgraphNode<dg::pta::PSNode>)._successors.
                super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (callNode->super_SubgraphNode<dg::pta::PSNode>)._successors.
     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
     super__Vector_impl_data._M_finish != ppPVar1)) {
    SubgraphNode<dg::pta::PSNode>::_removeThisFromSuccessorsPredecessors
              (&callNode->super_SubgraphNode<dg::pta::PSNode>,*ppPVar1);
    ppPVar1 = (callNode->super_SubgraphNode<dg::pta::PSNode>)._successors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((callNode->super_SubgraphNode<dg::pta::PSNode>)._successors.
        super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppPVar1) {
      (callNode->super_SubgraphNode<dg::pta::PSNode>)._successors.
      super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar1;
    }
  }
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addInterproceduralOperands(
        const llvm::Function *F, PointerSubgraph &subg,
        const llvm::CallInst *CI, PSNode *callNode) {
    assert((!CI || callNode) && (!callNode || CI));

    // add operands to arguments' PHI nodes
    addArgumentsOperands(F, CI);

    if (F->isVarArg()) {
        assert(subg.vararg);
        if (CI)
            // funcptr call
            addVariadicArgumentOperands(F, CI, subg.vararg);
        else
            addVariadicArgumentOperands(F, subg.vararg);
    }

    if (!subg.returnNodes.empty()) {
        addReturnNodesOperands(F, subg, callNode);
    } else if (callNode) {
        // disconnect call-return nodes
        auto *callReturnNode = PSNodeCallRet::cast(callNode->getPairedNode());
        assert(callReturnNode && callNode != callReturnNode);
        (void) callReturnNode; // c++17 TODO: replace with [[maybe_unused]]

        if (callNode->successorsNum() != 0) {
            assert(callNode->getSingleSuccessor() == callReturnNode);
            callNode->removeSingleSuccessor();
        } else {
            // the call does not return
            assert(callNode->successorsNum() == 0);
        }
    }
}